

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_static_analyzer.cpp
# Opt level: O0

int process_stream_file(char *stream_file_name)

{
  istreambuf_iterator<char,_std::char_traits<char>_> __end;
  istreambuf_iterator<char,_std::char_traits<char>_> __beg;
  byte bVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  char *pcVar5;
  long lVar6;
  char *pcVar7;
  undefined8 in_RDI;
  string child;
  string parent;
  char *dot;
  string buf;
  bool insideCode;
  string sqconfig;
  string code;
  TrustedContext trustedContext;
  string fileName;
  char *p;
  int res;
  string stream;
  ifstream tmp;
  string *in_stack_fffffffffffffab8;
  istreambuf_iterator<char,_std::char_traits<char>_> *in_stack_fffffffffffffac0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffac8;
  istreambuf_iterator<char,_std::char_traits<char>_> *in_stack_fffffffffffffad0;
  allocator *paVar8;
  ulong local_520;
  allocator<char> *in_stack_fffffffffffffaf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb00;
  undefined8 in_stack_fffffffffffffb08;
  undefined4 in_stack_fffffffffffffb10;
  undefined4 in_stack_fffffffffffffb14;
  streambuf_type *in_stack_fffffffffffffb18;
  char *in_stack_fffffffffffffb20;
  undefined1 local_499 [33];
  string local_478 [39];
  allocator local_451;
  string local_450 [16];
  string *in_stack_fffffffffffffbc0;
  string *in_stack_fffffffffffffbc8;
  char *pcVar9;
  allocator local_421;
  string local_420 [39];
  allocator local_3f9;
  string local_3f8 [32];
  string local_3d8 [39];
  byte local_3b1;
  string local_3b0 [32];
  string local_390 [36];
  undefined4 local_36c;
  string local_368 [32];
  char *local_348;
  uint local_340;
  allocator local_339;
  string local_338 [32];
  string local_318 [32];
  string local_2f8 [39];
  allocator<char> local_2d1 [33];
  string local_2b0 [32];
  int local_290;
  allocator local_289;
  string local_288 [32];
  string local_268 [32];
  string local_248 [48];
  undefined1 local_218 [532];
  uint local_4;
  
  std::ifstream::ifstream(local_218,in_RDI,8);
  bVar1 = std::ios::fail();
  if ((bVar1 & 1) == 0) {
    std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
              (in_stack_fffffffffffffad0,(istream_type *)in_stack_fffffffffffffac8);
    std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
              (in_stack_fffffffffffffac0);
    std::allocator<char>::allocator();
    __beg._8_8_ = in_stack_fffffffffffffb20;
    __beg._M_sbuf = in_stack_fffffffffffffb18;
    __end._M_c = in_stack_fffffffffffffb10;
    __end._M_sbuf = (streambuf_type *)in_stack_fffffffffffffb08;
    __end._12_4_ = in_stack_fffffffffffffb14;
    std::__cxx11::string::string<std::istreambuf_iterator<char,std::char_traits<char>>,void>
              (in_stack_fffffffffffffb00,__beg,__end,in_stack_fffffffffffffaf8);
    std::allocator<char>::~allocator(local_2d1);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      local_340 = 0;
      local_348 = (char *)std::__cxx11::string::c_str();
      std::__cxx11::string::string(local_368);
      local_36c = 2;
      std::__cxx11::string::string(local_390);
      std::__cxx11::string::string(local_3b0);
      local_3b1 = 0;
      do {
        std::__cxx11::string::string(local_3d8);
        local_348 = next_string((char *)in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
        if ((local_3b1 & 1) != 0) {
          pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_3d8);
          if ((*pcVar5 != '#') ||
             (pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_3d8), *pcVar5 != '#'))
          {
            std::__cxx11::string::operator+=(local_390,local_3d8);
            std::__cxx11::string::operator+=(local_390,"\n");
          }
          pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_3d8);
          if (((*pcVar5 == '#') &&
              (pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_3d8), *pcVar5 == '#'))
             || (*local_348 == '\0')) {
            uVar2 = process_single_source
                              ((string *)buf.field_2._8_8_,
                               (string *)buf.field_2._M_allocated_capacity,
                               (string *)buf._M_string_length,(bool)buf._7_1_,(bool)buf._6_1_);
            local_340 = uVar2 | local_340;
            local_3b1 = 0;
          }
        }
        if (*local_348 == '\0') {
          local_290 = 2;
        }
        else {
          pcVar5 = (char *)std::__cxx11::string::c_str();
          iVar3 = strncmp(pcVar5,"###[FILE_NAME]",0xe);
          if (iVar3 == 0) {
            lVar6 = std::__cxx11::string::c_str();
            pcVar5 = (char *)(lVar6 + 0xe);
            paVar8 = &local_3f9;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_3f8,pcVar5,paVar8);
            std::__cxx11::string::operator=(local_368,local_3f8);
            std::__cxx11::string::~string(local_3f8);
            std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
            trusted::clear();
            std::__cxx11::string::clear();
            local_3b1 = 0;
          }
          else {
            pcVar5 = (char *)std::__cxx11::string::c_str();
            iVar3 = strncmp(pcVar5,"###[SQCONFIG]",0xd);
            if (iVar3 == 0) {
              lVar6 = std::__cxx11::string::c_str();
              paVar8 = &local_421;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_420,(char *)(lVar6 + 0xd),paVar8);
              std::__cxx11::string::operator=(local_3b0,local_420);
              std::__cxx11::string::~string(local_420);
              std::allocator<char>::~allocator((allocator<char> *)&local_421);
            }
            else {
              pcVar5 = (char *)std::__cxx11::string::c_str();
              iVar3 = strcmp(pcVar5,"###[LOCALS]");
              if (iVar3 == 0) {
                local_36c = 3;
              }
              else {
                pcVar5 = (char *)std::__cxx11::string::c_str();
                iVar3 = strcmp(pcVar5,"###[GLOBALS]");
                if (iVar3 == 0) {
                  local_36c = 4;
                }
                else {
                  pcVar5 = (char *)std::__cxx11::string::c_str();
                  iVar3 = strcmp(pcVar5,"###[CONSTANTS]");
                  if (iVar3 == 0) {
                    local_36c = 2;
                  }
                  else {
                    pcVar5 = (char *)std::__cxx11::string::c_str();
                    iVar3 = strcmp(pcVar5,"###[CODE]");
                    if (iVar3 == 0) {
                      local_3b1 = 1;
                    }
                    else {
                      uVar4 = std::__cxx11::string::empty();
                      if (((uVar4 & 1) == 0) && ((local_3b1 & 1) == 0)) {
                        pcVar5 = (char *)std::__cxx11::string::c_str();
                        pcVar5 = strchr(pcVar5,0x2e);
                        pcVar7 = (char *)std::__cxx11::string::c_str();
                        if (pcVar5 == (char *)0x0) {
                          local_520 = std::__cxx11::string::length();
                        }
                        else {
                          pcVar9 = pcVar5;
                          lVar6 = std::__cxx11::string::c_str();
                          local_520 = (long)pcVar5 - lVar6;
                          pcVar5 = pcVar9;
                        }
                        paVar8 = &local_451;
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string(local_450,pcVar7,local_520,paVar8);
                        std::allocator<char>::~allocator((allocator<char> *)&local_451);
                        std::__cxx11::string::string(local_478);
                        if (pcVar5 != (char *)0x0) {
                          in_stack_fffffffffffffab8 = (string *)(pcVar5 + 1);
                          in_stack_fffffffffffffac0 =
                               (istreambuf_iterator<char,_std::char_traits<char>_> *)local_499;
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string
                                    ((string *)(local_499 + 1),(char *)in_stack_fffffffffffffab8,
                                     (allocator *)in_stack_fffffffffffffac0);
                          std::__cxx11::string::operator=(local_478,(string *)(local_499 + 1));
                          std::__cxx11::string::~string((string *)(local_499 + 1));
                          std::allocator<char>::~allocator((allocator<char> *)local_499);
                        }
                        trusted::add((TrustedContext)((ulong)pcVar5 >> 0x20),
                                     in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
                        std::__cxx11::string::~string(local_478);
                        std::__cxx11::string::~string(local_450);
                      }
                    }
                  }
                }
              }
            }
          }
          local_290 = 0;
        }
        std::__cxx11::string::~string(local_3d8);
      } while (local_290 == 0);
      local_4 = local_340;
      local_290 = 1;
      std::__cxx11::string::~string(local_3b0);
      std::__cxx11::string::~string(local_390);
      std::__cxx11::string::~string(local_368);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_338,"Stream file is empty \'",&local_339);
      std::operator+(in_stack_fffffffffffffac8,(char *)in_stack_fffffffffffffac0);
      std::operator+(in_stack_fffffffffffffac8,(char *)in_stack_fffffffffffffac0);
      std::__cxx11::string::c_str();
      CompilationContext::globalError(in_stack_fffffffffffffb20);
      std::__cxx11::string::~string(local_2f8);
      std::__cxx11::string::~string(local_318);
      std::__cxx11::string::~string(local_338);
      std::allocator<char>::~allocator((allocator<char> *)&local_339);
      local_4 = 1;
      local_290 = 1;
    }
    std::__cxx11::string::~string(local_2b0);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_288,"Cannot open strem file \'",&local_289);
    std::operator+(in_stack_fffffffffffffac8,(char *)in_stack_fffffffffffffac0);
    std::operator+(in_stack_fffffffffffffac8,(char *)in_stack_fffffffffffffac0);
    std::__cxx11::string::c_str();
    CompilationContext::globalError(in_stack_fffffffffffffb20);
    std::__cxx11::string::~string(local_248);
    std::__cxx11::string::~string(local_268);
    std::__cxx11::string::~string(local_288);
    std::allocator<char>::~allocator((allocator<char> *)&local_289);
    local_4 = 1;
    local_290 = 1;
  }
  std::ifstream::~ifstream(local_218);
  return local_4;
}

Assistant:

int process_stream_file(const char * stream_file_name)
{
  ifstream tmp(stream_file_name);
  if (tmp.fail())
  {
    CompilationContext::globalError((string("Cannot open strem file '") + stream_file_name + "'").c_str());
    return 1;
  }

  string stream((std::istreambuf_iterator<char>(tmp)), std::istreambuf_iterator<char>());
  if (stream.empty())
  {
    CompilationContext::globalError((string("Stream file is empty '") + stream_file_name + "'").c_str());
    return 1;
  }

  int res = 0;
  const char * p = stream.c_str();

  string fileName;
  trusted::TrustedContext trustedContext = trusted::TR_CONST;
  string code;
  string sqconfig;
  bool insideCode = false;

  for (;;)
  {
    string buf;
    p = next_string(p, buf);

    if (insideCode)
    {
      if (buf[0] != '#' || buf[1] != '#')
      {
        code += buf;
        code += "\n";
      }

      if ((buf[0] == '#' && buf[1] == '#') || !*p) // end of code
      {
        res |= process_single_source(fileName, code, sqconfig, false, false);
        insideCode = false;
      }
    }

    if (!*p)
      break;

    if (!strncmp(buf.c_str(), "###[FILE_NAME]", sizeof("###[FILE_NAME]") - 1))
    {
      fileName = string(buf.c_str() + sizeof("###[FILE_NAME]") - 1);
      trusted::clear();
      code.clear();
      insideCode = false;
    }
    else if (!strncmp(buf.c_str(), "###[SQCONFIG]", sizeof("###[SQCONFIG]") - 1))
      sqconfig = string(buf.c_str() + sizeof("###[SQCONFIG]") - 1);
    else if (!strcmp(buf.c_str(), "###[LOCALS]"))
      trustedContext = trusted::TR_LOCAL;
    else if (!strcmp(buf.c_str(), "###[GLOBALS]"))
      trustedContext = trusted::TR_GLOBAL;
    else if (!strcmp(buf.c_str(), "###[CONSTANTS]"))
      trustedContext = trusted::TR_CONST;
    else if (!strcmp(buf.c_str(), "###[CODE]"))
    {
      insideCode = true;
    }
    else if (!buf.empty() && !insideCode)
    {
      const char * dot = strchr(buf.c_str(), '.');
      string parent(buf.c_str(), dot ? dot - buf.c_str() : buf.length());
      string child;
      if (dot)
        child = string(dot + 1);

      trusted::add(trustedContext, parent, child);
    }
  }

  return res;
}